

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix,bool computeU)

{
  HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Scalar scale;
  Scalar local_58;
  HouseholderSequenceType local_50;
  
  if (*(long *)(matrix + 0x10) == *(long *)(matrix + 8)) {
    local_50.m_vectors = (Nested)matrix;
    local_58 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::maxCoeff<0>((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              *)&local_50);
    if (2.2250738585072014e-308 <= local_58) {
      this_00 = (HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x40);
      MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_50,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)matrix,&local_58);
      HessenbergDecomposition<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((HessenbergDecomposition<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_50);
      PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x30),
                 *(Index *)(matrix + 0x10));
      if (computeU) {
        HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixQ
                  (&local_50,this_00);
        HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
        ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
                    *)&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),
                   (Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x30));
      }
      local_50.m_vectors =
           (Nested)HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixH
                             (this_00);
      computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (this,(HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       *)&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),computeU);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,&local_58);
    }
    else {
      PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
                 *(Index *)(matrix + 8),*(Index *)(matrix + 0x10));
      if (computeU) {
        MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x18),
                   *(Index *)(matrix + 8),*(Index *)(matrix + 0x10));
      }
      *(undefined4 *)(this + 0x80) = 0;
      this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
      this[0x85] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)computeU;
    }
    return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  }
  __assert_fail("matrix.cols() == matrix.rows()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/RealSchur.h"
                ,0xfd,
                "RealSchur<MatrixType> &Eigen::RealSchur<Eigen::Matrix<double, -1, -1>>::compute(const EigenBase<InputType> &, bool) [_MatrixType = Eigen::Matrix<double, -1, -1>, InputType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

inline void RealSchur<MatrixType>::initFrancisQRStep(Index il, Index iu, const Vector3s& shiftInfo, Index& im, Vector3s& firstHouseholderVector)
{
  using std::abs;
  Vector3s& v = firstHouseholderVector; // alias to save typing

  for (im = iu-2; im >= il; --im)
  {
    const Scalar Tmm = m_matT.coeff(im,im);
    const Scalar r = shiftInfo.coeff(0) - Tmm;
    const Scalar s = shiftInfo.coeff(1) - Tmm;
    v.coeffRef(0) = (r * s - shiftInfo.coeff(2)) / m_matT.coeff(im+1,im) + m_matT.coeff(im,im+1);
    v.coeffRef(1) = m_matT.coeff(im+1,im+1) - Tmm - r - s;
    v.coeffRef(2) = m_matT.coeff(im+2,im+1);
    if (im == il) {
      break;
    }
    const Scalar lhs = m_matT.coeff(im,im-1) * (abs(v.coeff(1)) + abs(v.coeff(2)));
    const Scalar rhs = v.coeff(0) * (abs(m_matT.coeff(im-1,im-1)) + abs(Tmm) + abs(m_matT.coeff(im+1,im+1)));
    if (abs(lhs) < NumTraits<Scalar>::epsilon() * rhs)
      break;
  }
}